

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

pool_ptr<soul::AST::Expression> __thiscall
soul::StructuralParser::parseDelayLength(StructuralParser *this)

{
  bool bVar1;
  Expression *pEVar2;
  StructuralParser *in_RSI;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&in_RSI->super_SOULTokeniser,(TokenType)0x29b4de);
  if (bVar1) {
    pEVar2 = parseExpression(in_RSI,false);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&in_RSI->super_SOULTokeniser,(TokenType)0x29aa2b);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&in_RSI->super_SOULTokeniser,(TokenType)0x275fc2);
  }
  else {
    pEVar2 = (Expression *)0x0;
  }
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar2;
  return (pool_ptr<soul::AST::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<AST::Expression> parseDelayLength()
    {
        if (matchIf (Operator::openBracket))
        {
            auto& e = parseExpression();
            expect (Operator::closeBracket);
            expect (Operator::rightArrow);
            return e;
        }

        return {};
    }